

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O3

void __thiscall discordpp::MessageReference::~MessageReference(MessageReference *this)

{
  _Head_base<0UL,_bool_*,_false> _Var1;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var2;
  
  _Var1._M_head_impl =
       (this->fail_if_not_exists).super_field<bool>.t_._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (bool *)0x0) {
    operator_delete(_Var1._M_head_impl,1);
  }
  (this->fail_if_not_exists).super_field<bool>.t_._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (bool *)0x0;
  _Var2._M_head_impl =
       (this->guild_id).super_field<discordpp::Snowflake>.t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (Snowflake *)0x0) {
    operator_delete(_Var2._M_head_impl,8);
  }
  (this->guild_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
  _Var2._M_head_impl =
       (this->channel_id).super_field<discordpp::Snowflake>.t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (Snowflake *)0x0) {
    operator_delete(_Var2._M_head_impl,8);
  }
  (this->channel_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
  _Var2._M_head_impl =
       (this->message_id).super_field<discordpp::Snowflake>.t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (Snowflake *)0x0) {
    operator_delete(_Var2._M_head_impl,8);
  }
  (this->message_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
  return;
}

Assistant:

MessageReference(
        omittable_field<Snowflake> message_id = omitted,
        omittable_field<Snowflake> channel_id = omitted,
        omittable_field<Snowflake> guild_id = omitted,
        omittable_field<bool> fail_if_not_exists = omitted
    ):
        message_id(message_id),
        channel_id(channel_id),
        guild_id(guild_id),
        fail_if_not_exists(fail_if_not_exists)
    {}